

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>
::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *valueMap,Index columnIndex)

{
  long *plVar1;
  pointer puVar2;
  void *pvVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  pointer puVar6;
  long lVar7;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  **ppEVar8;
  iterator iVar9;
  iterator iVar10;
  ulong uVar11;
  undefined8 uVar12;
  undefined8 *puVar13;
  long *plVar14;
  Entry *entry;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  **local_58;
  iterator iStack_50;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  **local_48;
  ID_index local_3c;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
  *local_38;
  
  if (*(long *)(this + 0x30) == 0) {
    puVar4 = *(undefined8 **)this;
    puVar5 = *(undefined8 **)(this + 8);
    if (puVar4 != puVar5) {
      puVar2 = (valueMap->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = (valueMap->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar13 = puVar4;
      do {
        uVar11 = (ulong)*(uint *)*puVar13;
        if ((ulong)((long)puVar6 - (long)puVar2 >> 2) <= uVar11) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          goto LAB_00172cff;
        }
        *(uint *)*puVar13 = puVar2[uVar11];
        puVar13 = puVar13 + 1;
      } while (puVar13 != puVar5);
      if (puVar4 != puVar5) {
        uVar11 = (long)puVar5 - (long)puVar4 >> 3;
        lVar7 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>**,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>const*)_1_>>
                  (puVar4,puVar5,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>**,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>const*)_1_>>
                  (puVar4,puVar5);
        return;
      }
    }
  }
  else {
    local_58 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
                **)0x0;
    iStack_50._M_current =
         (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
          **)0x0;
    local_48 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
                **)0x0;
    plVar14 = *(long **)this;
    plVar1 = *(long **)(this + 8);
    if (plVar14 != plVar1) {
      do {
        local_38 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
                    *)*plVar14;
        local_3c = local_38->rowIndex_;
        iVar10 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)(this + 0x18),&local_3c);
        if (iVar10.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          puVar2 = (valueMap->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(valueMap->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <=
              (ulong)local_38->rowIndex_) {
LAB_00172cff:
            uVar12 = std::__throw_out_of_range_fmt
                               (
                               "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               );
            if (local_58 !=
                (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
                 **)0x0) {
              operator_delete(local_58,(long)local_48 - (long)local_58);
            }
            _Unwind_Resume(uVar12);
          }
          local_38->rowIndex_ = puVar2[local_38->rowIndex_];
          if (iStack_50._M_current == local_48) {
            std::
            vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*>>
            ::
            _M_realloc_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*const&>
                      ((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*>>
                        *)&local_58,iStack_50,&local_38);
          }
          else {
            *iStack_50._M_current = local_38;
            iStack_50._M_current = iStack_50._M_current + 1;
          }
        }
        else {
          operator_delete(local_38,4);
        }
        iVar9._M_current = iStack_50._M_current;
        ppEVar8 = local_58;
        plVar14 = plVar14 + 1;
      } while (plVar14 != plVar1);
      if (local_58 != iStack_50._M_current) {
        uVar11 = (long)iStack_50._M_current - (long)local_58 >> 3;
        lVar7 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>**,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>const*)_2_>>
                  (local_58,iStack_50._M_current,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>**,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,false,false,false>>>const*)_2_>>
                  (ppEVar8,iVar9._M_current);
      }
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)(this + 0x18));
    pvVar3 = *(void **)this;
    uVar12 = *(undefined8 *)(this + 8);
    lVar7 = *(long *)(this + 0x10);
    *(Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
      ***)this = local_58;
    *(Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
      ***)(this + 8) = iStack_50._M_current;
    *(Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
      ***)(this + 0x10) = local_48;
    if (pvVar3 != (void *)0x0) {
      local_58 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
                  **)pvVar3;
      iStack_50._M_current =
           (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
            **)uVar12;
      local_48 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_false,_false,_false>_>_>
                  **)lVar7;
      operator_delete(pvVar3,lVar7 - (long)pvVar3);
    }
  }
  return;
}

Assistant:

inline void Vector_column<Master_matrix>::reorder(const Row_index_map& valueMap, [[maybe_unused]] Index columnIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  if (erasedValues_.empty()) {  // to avoid useless push_backs.
    for (Entry* entry : column_) {
      if constexpr (Master_matrix::Option_list::has_row_access) {
        RA_opt::unlink(entry);
        if (columnIndex != Master_matrix::template get_null_value<Index>()) entry->set_column_index(columnIndex);
      }
      entry->set_row_index(valueMap.at(entry->get_row_index()));
      if constexpr (Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access)
        RA_opt::insert_entry(entry->get_row_index(), entry);
    }

    // all entries have to be deleted first, to avoid problem with insertion when row is a set
    if constexpr (!Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access) {
      for (Entry* entry : column_) {
        RA_opt::insert_entry(entry->get_row_index(), entry);
      }
    }

    std::sort(column_.begin(), column_.end(), [](const Entry* c1, const Entry* c2) { return *c1 < *c2; });
  } else {
    Column_support newColumn;
    for (Entry* entry : column_) {
      if (erasedValues_.find(entry->get_row_index()) == erasedValues_.end()) {
        if constexpr (Master_matrix::Option_list::has_row_access) {
          RA_opt::unlink(entry);
          if (columnIndex != Master_matrix::template get_null_value<Index>()) entry->set_column_index(columnIndex);
        }
        entry->set_row_index(valueMap.at(entry->get_row_index()));
        newColumn.push_back(entry);
        if constexpr (Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access)
          RA_opt::insert_entry(entry->get_row_index(), entry);
      } else {
        _delete_entry(entry);
      }
    }
    // all entries have to be deleted first, to avoid problem with insertion when row is a set
    if constexpr (!Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access) {
      for (Entry* entry : column_) {
        RA_opt::insert_entry(entry->get_row_index(), entry);
      }
    }
    std::sort(newColumn.begin(), newColumn.end(), [](const Entry* c1, const Entry* c2) { return *c1 < *c2; });
    erasedValues_.clear();
    column_.swap(newColumn);
  }
}